

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  void **ppvVar1;
  uint8_t *puVar2;
  int iVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  run_container_t *run;
  long lVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  run_container_t *prVar12;
  min_max_sum_t mms;
  undefined8 local_40;
  uint64_t local_38;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar4 = roaring_bitmap_get_cardinality(r);
  stat->cardinality = uVar4;
  local_40 = 0xffffffff;
  local_38 = 0;
  roaring_iterate(r,min_max_sum_fnc,&local_40);
  stat->max_value = (int)((ulong)local_40 >> 0x20);
  stat->min_value = (int)local_40;
  stat->sum_value = local_38;
  lVar9 = (long)(r->high_low_container).size;
  if (0 < lVar9) {
    ppvVar1 = (r->high_low_container).containers;
    puVar2 = (r->high_low_container).typecodes;
    lVar7 = 0;
    do {
      prVar12 = (run_container_t *)ppvVar1[lVar7];
      uVar10 = puVar2[lVar7];
      run = prVar12;
      uVar11 = uVar10;
      if (uVar10 == '\x04') {
        uVar11 = *(uint8_t *)&prVar12->runs;
        if (uVar11 == '\x04') goto LAB_00113584;
        run = *(run_container_t **)prVar12;
      }
      if (uVar11 == '\x03') {
        lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
          iVar3 = run->n_runs;
          lVar6 = (long)iVar3;
          if (0 < lVar6) {
            lVar8 = 0;
            do {
              iVar3 = iVar3 + (uint)run->runs[lVar8].length;
              lVar8 = lVar8 + 1;
            } while (lVar6 != lVar8);
          }
        }
        else {
          iVar3 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        if ((uVar11 != '\x02') && (uVar11 != '\x01')) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar3 = run->n_runs;
      }
      if (uVar10 == '\x04') {
        uVar10 = *(uint8_t *)&prVar12->runs;
        if (uVar10 == '\x04') {
LAB_00113584:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        prVar12 = *(run_container_t **)prVar12;
      }
      if (uVar10 == '\x01') {
        iVar5 = 0x2000;
      }
      else if (uVar10 == '\x03') {
        iVar5 = prVar12->n_runs * 4 + 2;
      }
      else {
        if (uVar10 != '\x02') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
        }
        iVar5 = prVar12->n_runs * 2;
      }
      if (uVar11 == '\x03') {
        stat->n_run_containers = stat->n_run_containers + 1;
        stat->n_values_run_containers = stat->n_values_run_containers + iVar3;
        stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar5;
      }
      else if (uVar11 == '\x02') {
        stat->n_array_containers = stat->n_array_containers + 1;
        stat->n_values_array_containers = stat->n_values_array_containers + iVar3;
        stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar5;
      }
      else {
        if (uVar11 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x3be7,
                        "void roaring_bitmap_statistics(const roaring_bitmap_t *, roaring_statistics_t *)"
                       );
        }
        stat->n_bitset_containers = stat->n_bitset_containers + 1;
        stat->n_values_bitset_containers = stat->n_values_bitset_containers + iVar3;
        stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar5;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar9);
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                __builtin_unreachable();
        }
    }
}